

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O1

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_short,2>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int param_5)

{
  uint *puVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  
  iVar6 = k->v1;
  if (iVar6 != k->v2) {
    fVar2 = k->A;
    do {
      iVar5 = k->rowlen - iVar6;
      iVar4 = iVar5 - k->w2;
      if (iVar4 < k->u1) {
        iVar4 = k->u1;
      }
      iVar5 = iVar5 - k->w1;
      if (k->u2 < iVar5) {
        iVar5 = k->u2;
      }
      if (0 < iVar5 - iVar4) {
        puVar7 = (uint *)((long)data + (long)((k->rowlen * iVar6 + iVar4) * 2) * 2);
        puVar1 = (uint *)((long)puVar7 + (long)((iVar5 - iVar4) * 2) * 2);
        fVar10 = (float)iVar4 - k->u;
        fVar9 = (float)iVar6 - k->v;
        fVar11 = fVar10 * k->A * fVar10 + (k->B * fVar10 + k->C * fVar9) * fVar9;
        fVar9 = (fVar10 + fVar10 + 1.0) * k->A + fVar9 * k->B;
        do {
          if (fVar11 < 1.0) {
            fVar10 = expf(fVar11 * -6.125);
            fVar10 = fVar10 * k->wscale;
            k->weight = k->weight + fVar10;
            uVar3 = *puVar7;
            auVar8._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
            auVar8._4_2_ = (short)(uVar3 >> 0x10);
            auVar8._0_4_ = uVar3;
            *(ulong *)result =
                 CONCAT44(fVar10 * (float)auVar8._4_4_ +
                          (float)((ulong)*(undefined8 *)result >> 0x20),
                          fVar10 * (float)(uVar3 & 0xffff) + (float)*(undefined8 *)result);
          }
          fVar11 = fVar11 + fVar9;
          fVar9 = fVar9 + fVar2 + fVar2;
          puVar7 = puVar7 + 1;
        } while (puVar7 < puVar1);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != k->v2);
  }
  return;
}

Assistant:

void Apply(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        int nTxChan = nChan;
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }